

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void BeginEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,
                   FuncInfo *funcInfo)

{
  OpCode OVar1;
  Scope *innerScope;
  ParseNode *this;
  code *pcVar2;
  DiagExtraScopesType scopeType;
  FuncInfo *this_00;
  bool bVar3;
  uint uVar4;
  RegSlot RVar5;
  RegSlot regEnv;
  DebuggerScope *debuggerScope;
  undefined4 *puVar6;
  ParseNodePtr *ppPVar7;
  ParseNodeFnc *pPVar8;
  ParseNodeCatch *pPVar9;
  ParseNodeBlock *pPVar10;
  ParseNodeWith *pPVar11;
  FuncInfo *funcInfo_00;
  RegSlot local_4c;
  DebuggerScope *pDStack_48;
  int scopeIndex;
  FuncInfo *local_40;
  RegSlot local_38;
  char local_31;
  
  bVar3 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  innerScope = pnodeBlock->scope;
  if (!bVar3) {
    if (innerScope == (Scope *)0x0) {
      scopeType = DiagBlockScopeInSlot;
    }
    else if ((innerScope->field_0x44 & 0x10) == 0) {
      scopeType = DiagBlockScopeDirect;
    }
    else {
      scopeType = DiagBlockScopeInObject;
    }
    funcInfo_00 = (FuncInfo *)0xffffffffffffffff;
    debuggerScope =
         ByteCodeGenerator::RecordStartScopeObject
                   (byteCodeGenerator,(ParseNode *)pnodeBlock,scopeType,0xffffffff,(int *)0x0);
LAB_00757593:
    ByteCodeGenerator::InitBlockScopedContent
              (byteCodeGenerator,pnodeBlock,debuggerScope,funcInfo_00);
    return;
  }
  ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
  local_40 = funcInfo;
  if ((innerScope->field_0x44 & 0x10) == 0) {
    funcInfo_00 = (FuncInfo *)0xffffffffffffffff;
    debuggerScope =
         ByteCodeGenerator::RecordStartScopeObject
                   (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeDirect,0xffffffff,
                    (int *)0x0);
  }
  else {
    if (innerScope->location != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2ff,"(scopeLocation == Js::Constants::NoRegister)",
                         "scopeLocation == Js::Constants::NoRegister");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    RVar5 = FuncInfo::FirstInnerScopeReg(funcInfo);
    uVar4 = RVar5 + innerScope->innerScopeIndex;
    if ((innerScope->field_0x44 & 2) == 0) {
      local_4c = 0xffffffff;
      debuggerScope =
           ByteCodeGenerator::RecordStartScopeObject
                     (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeInSlot,uVar4,
                      (int *)&local_4c);
      uVar4 = innerScope->scopeSlotCount + 2;
      funcInfo_00 = (FuncInfo *)(ulong)uVar4;
      Js::ByteCodeWriter::Num3
                (&byteCodeGenerator->m_writer,NewInnerScopeSlots,innerScope->innerScopeIndex,uVar4,
                 local_4c);
    }
    else {
      funcInfo_00 = (FuncInfo *)(ulong)uVar4;
      debuggerScope =
           ByteCodeGenerator::RecordStartScopeObject
                     (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeInObject,uVar4,
                      (int *)0x0);
      Js::ByteCodeWriter::Unsigned1
                (&byteCodeGenerator->m_writer,NewBlockScope,innerScope->innerScopeIndex);
    }
  }
  local_31 = Scope::IsGlobalEvalBlockScope(innerScope);
  ppPVar7 = &pnodeBlock->pnodeScopes;
  RVar5 = 0xffffffff;
  local_38 = 0xffffffff;
LAB_0075747d:
  do {
    this = *ppPVar7;
    do {
      if (this == (ParseNode *)0x0) {
        if (RVar5 != 0xffffffff) {
          FuncInfo::ReleaseTmpRegister(local_40,RVar5);
        }
        goto LAB_00757593;
      }
      OVar1 = this->nop;
      if (OVar1 == knopCatch) {
        pPVar9 = ParseNode::AsParseNodeCatch(this);
        ppPVar7 = &pPVar9->pnodeNext;
        goto LAB_0075747d;
      }
      if (OVar1 == knopBlock) {
        pPVar10 = ParseNode::AsParseNodeBlock(this);
        ppPVar7 = &pPVar10->pnodeNext;
        goto LAB_0075747d;
      }
      if (OVar1 == knopWith) {
        pPVar11 = ParseNode::AsParseNodeWith(this);
        ppPVar7 = &pPVar11->pnodeNext;
        goto LAB_0075747d;
      }
    } while (OVar1 != knopFncDecl);
    pPVar8 = ParseNode::AsParseNodeFnc(this);
    this_00 = local_40;
    pDStack_48 = debuggerScope;
    if ((pPVar8->fncFlags & kFunctionDeclaration) != kFunctionNone) {
      regEnv = local_38;
      if (local_38 == 0xffffffff) {
        RVar5 = local_40->frameDisplayRegister;
        if (RVar5 == 0xffffffff) {
          RVar5 = FuncInfo::GetEnvRegister(local_40);
        }
        local_38 = RVar5;
        RVar5 = FuncInfo::AcquireTmpRegister(this_00);
        regEnv = ByteCodeGenerator::PrependLocalScopes(byteCodeGenerator,local_38,RVar5,this_00);
      }
      pPVar8 = ParseNode::AsParseNodeFnc(this);
      funcInfo_00 = (FuncInfo *)&DAT_00000001;
      local_38 = regEnv;
      ByteCodeGenerator::DefineOneFunction(byteCodeGenerator,pPVar8,local_40,true,regEnv,0xffffffff)
      ;
    }
    if (local_31 != '\0') {
      FuncInfo::ReleaseLoc(local_40,this);
      this->location = 0xffffffff;
    }
    pPVar8 = ParseNode::AsParseNodeFnc(this);
    ppPVar7 = &pPVar8->pnodeNext;
    debuggerScope = pDStack_48;
  } while( true );
}

Assistant:

void BeginEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Js::DebuggerScope* debuggerScope = nullptr;

    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        Scope *scope = pnodeBlock->scope;
        byteCodeGenerator->PushScope(scope);

        Js::RegSlot scopeLocation = scope->GetLocation();
        if (scope->GetMustInstantiate())
        {
            Assert(scopeLocation == Js::Constants::NoRegister);
            scopeLocation = funcInfo->FirstInnerScopeReg() + scope->GetInnerScopeIndex();

            if (scope->GetIsObject())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject, scopeLocation);

                byteCodeGenerator->Writer()->Unsigned1(Js::OpCode::NewBlockScope, scope->GetInnerScopeIndex());
            }
            else
            {
                int scopeIndex = Js::DebuggerScope::InvalidScopeIndex;
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot, scopeLocation, &scopeIndex);

                // TODO: Handle heap enumeration
                int scopeSlotCount = scope->GetScopeSlotCount();
                byteCodeGenerator->Writer()->Num3(Js::OpCode::NewInnerScopeSlots, scope->GetInnerScopeIndex(), scopeSlotCount + Js::ScopeSlots::FirstSlotIndex, scopeIndex);
            }
        }
        else
        {
            // In the direct register access case, there is no block scope emitted but we can still track
            // the start and end offset of the block.  The location registers for let/const variables will still be
            // captured along with this range in InitBlockScopedContent().
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
        }

        bool const isGlobalEvalBlockScope = scope->IsGlobalEvalBlockScope();
        Js::RegSlot frameDisplayLoc = Js::Constants::NoRegister;
        Js::RegSlot tmpInnerEnvReg = Js::Constants::NoRegister;
        ParseNodePtr pnodeScope;
        for (pnodeScope = pnodeBlock->pnodeScopes; pnodeScope;)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    // The frameDisplayLoc register's lifetime has to be controlled by this function. We can't let
                    // it be released by DefineOneFunction, because further iterations of this loop can allocate
                    // temps, and we can't let frameDisplayLoc be re-purposed until this loop completes.
                    // So we'll supply a temp that we allocate and release here.
                    if (frameDisplayLoc == Js::Constants::NoRegister)
                    {
                        if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
                        {
                            frameDisplayLoc = funcInfo->frameDisplayRegister;
                        }
                        else
                        {
                            frameDisplayLoc = funcInfo->GetEnvRegister();
                        }
                        tmpInnerEnvReg = funcInfo->AcquireTmpRegister();
                        frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpInnerEnvReg, funcInfo);
                    }
                    byteCodeGenerator->DefineOneFunction(pnodeScope->AsParseNodeFnc(), funcInfo, true, frameDisplayLoc);
                }

                // If this is the global eval block scope, the function is actually assigned to the global
                // so we don't need to keep the registers.
                if (isGlobalEvalBlockScope)
                {
                    funcInfo->ReleaseLoc(pnodeScope);
                    pnodeScope->location = Js::Constants::NoRegister;
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }

        if (tmpInnerEnvReg != Js::Constants::NoRegister)
        {
            funcInfo->ReleaseTmpRegister(tmpInnerEnvReg);
        }
    }
    else
    {
        Scope *scope = pnodeBlock->scope;
        if (scope)
        {
            if (scope->GetMustInstantiate())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject);
            }
            else
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
            }
        }
        else
        {
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot);
        }
    }

    byteCodeGenerator->InitBlockScopedContent(pnodeBlock, debuggerScope, funcInfo);
}